

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::setAsUsed(CommonCore *this,BasicHandleInfo *hand)

{
  BasicHandleInfo *pBVar1;
  shared_mutex *__rwlock;
  
  if (hand->used != false) {
    return;
  }
  hand->used = true;
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock(&__rwlock->_M_impl);
  pBVar1 = HandleManager::getHandleInfo
                     (&(this->handles).m_obj,(InterfaceHandle)(hand->handle).handle.hid);
  pBVar1->used = true;
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return;
}

Assistant:

void CommonCore::setAsUsed(BasicHandleInfo* hand)
{
    assert(hand != nullptr);
    if (hand->used) {
        return;
    }
    hand->used = true;
    handles.modify([&](auto& handle) { handle.getHandleInfo(hand->handle.handle)->used = true; });
}